

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cross_entropy_loss.cc
# Opt level: O1

void xLearn::ce_evaluate_thread
               (vector<float,_std::allocator<float>_> *pred,
               vector<float,_std::allocator<float>_> *label,real_t *tmp_sum,size_t start_idx,
               size_t end_idx)

{
  undefined8 uVar1;
  bool bVar2;
  ostream *poVar3;
  size_t i;
  undefined1 auVar4 [16];
  float fVar5;
  Logger local_6c;
  string local_68;
  string local_48;
  
  if (end_idx < start_idx) {
    local_6c.severity_ = ERR;
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/loss/cross_entropy_loss.cc"
               ,"");
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"ce_evaluate_thread","");
    poVar3 = Logger::Start(ERR,&local_48,0x22,&local_68);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"CHECK_GE failed ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/loss/cross_entropy_loss.cc"
               ,0x68);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x22);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"end_idx",7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," = ",3);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"start_idx",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," = ",3);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
    Logger::~Logger(&local_6c);
    abort();
  }
  *tmp_sum = 0.0;
  if (start_idx < end_idx) {
    do {
      fVar5 = (pred->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
              super__Vector_impl_data._M_start[start_idx];
      auVar4._8_4_ = 0x80000000;
      auVar4._0_8_ = 0x8000000080000000;
      auVar4._12_4_ = 0x80000000;
      auVar4 = vxorps_avx512vl(ZEXT416((uint)fVar5),auVar4);
      uVar1 = vcmpss_avx512f(ZEXT816(0) << 0x40,
                             ZEXT416((uint)(label->super__Vector_base<float,_std::allocator<float>_>
                                           )._M_impl.super__Vector_impl_data._M_start[start_idx]),1)
      ;
      bVar2 = (bool)((byte)uVar1 & 1);
      fVar5 = expf((float)((uint)bVar2 * auVar4._0_4_ + (uint)!bVar2 * (int)fVar5));
      fVar5 = log1pf(fVar5);
      *tmp_sum = fVar5 + *tmp_sum;
      start_idx = start_idx + 1;
    } while (end_idx != start_idx);
  }
  return;
}

Assistant:

static void ce_evaluate_thread(const std::vector<real_t>* pred,
                              const std::vector<real_t>* label,
                              real_t* tmp_sum,
                              size_t start_idx,
                              size_t end_idx) {
  CHECK_GE(end_idx, start_idx);
  *tmp_sum = 0;
  for (size_t i = start_idx; i < end_idx; ++i) {
    real_t y = (*label)[i] > 0 ? 1.0 : -1.0;
    (*tmp_sum) += log1p(exp(-y*(*pred)[i]));
  }
}